

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.h
# Opt level: O1

string * __thiscall Type::surroundName(string *__return_storage_ptr__,Type *this,string *name)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string surroundName(const std::string& name) {
        return name;
    }